

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stringutil.cpp
# Opt level: O1

void __thiscall
StringUtil_ByteToString_Test::~StringUtil_ByteToString_Test(StringUtil_ByteToString_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(StringUtil, ByteToString) {
  std::vector<uint8_t> bytes(5);
  bytes[0] = 0x6a;
  bytes[1] = 0xcd;
  bytes[2] = 0x7a;
  bytes[3] = 0xde;
  bytes[4] = 0xf4;
  std::string result = StringUtil::ByteToString(bytes);
  EXPECT_STREQ(result.c_str(), "6acd7adef4");
}